

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::UseFolderProperty(cmGlobalGenerator *this)

{
  cmake *this_00;
  cmState *this_01;
  char *val;
  allocator local_41;
  string local_40;
  char *local_20;
  char *prop;
  cmGlobalGenerator *this_local;
  
  prop = (char *)this;
  this_00 = GetCMakeInstance(this);
  this_01 = cmake::GetState(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"USE_FOLDERS",&local_41);
  val = cmState::GetGlobalProperty(this_01,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (val == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_20 = val;
    this_local._7_1_ = cmSystemTools::IsOn(val);
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::UseFolderProperty() const
{
  const char* prop =
    this->GetCMakeInstance()->GetState()->GetGlobalProperty("USE_FOLDERS");

  // If this property is defined, let the setter turn this on or off...
  //
  if (prop) {
    return cmSystemTools::IsOn(prop);
  }

  // By default, this feature is OFF, since it is not supported in the
  // Visual Studio Express editions until VS11:
  //
  return false;
}